

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

int average(int argc,char **argv)

{
  Allocator alloc;
  Point2i p;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  Point2i p_00;
  FILE *__stream;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uVar5;
  Point2i PVar6;
  long *in_RSI;
  Float FVar7;
  Float value;
  undefined1 auVar8 [64];
  Float v;
  int c;
  int x;
  int y;
  Image *im;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::Image,_std::allocator<pbrt::Image>_> *__range1;
  Image avgImage;
  atomic<bool> failed;
  vector<pbrt::Image,_std::allocator<pbrt::Image>_> avgImages;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  anon_class_1_0_00000001 onError;
  string filenameBase;
  string avgFile;
  undefined1 auVar9 [40];
  vector<pbrt::Image,_std::allocator<pbrt::Image>_> *this;
  undefined1 in_stack_fffffffffffffb08 [64];
  char *in_stack_fffffffffffffb48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb58 [16];
  undefined1 auVar11 [16];
  char *in_stack_fffffffffffffb68;
  optional<float> *this_00;
  LogLevel level;
  WrapMode in_stack_fffffffffffffb84;
  WrapMode in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  WrapMode WVar12;
  WrapMode WVar13;
  int in_stack_fffffffffffffba0;
  optional<float> local_3d0 [3];
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_384;
  undefined4 local_344;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_340;
  undefined4 local_330;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_32c;
  undefined4 local_324;
  optional<int> in_stack_fffffffffffffce0;
  optional<float> in_stack_fffffffffffffce8;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  in_stack_fffffffffffffcf0;
  char ***in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd08;
  WrapMode local_2a4;
  int local_2a0;
  int local_298;
  int iStack_290;
  int local_28c;
  Point2<int> local_288;
  Tuple2<pbrt::Point2,_int> local_280;
  Point2<int> local_278;
  Tuple2<pbrt::Point2,_int> local_270;
  reference local_268;
  Image *local_260;
  __normal_iterator<pbrt::Image_*,_std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>_>
  local_258;
  undefined1 *local_250;
  Image local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 local_ea [2];
  undefined1 local_e8 [28];
  undefined4 local_cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8 [3];
  allocator<char> local_79;
  string local_78 [40];
  string local_50 [32];
  string local_30 [32];
  long *local_10;
  int local_4;
  undefined1 auVar10 [24];
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  while (*local_10 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb08._56_8_)
    ;
    std::function<void(std::__cxx11::string)>::function<average(int,char**)::__0&,void>
              (in_stack_fffffffffffffb08._24_8_,in_stack_fffffffffffffb08._16_8_);
    bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                      (in_stack_fffffffffffffcf8,(string *)in_stack_fffffffffffffcf0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffce8,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)in_stack_fffffffffffffce0);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)0x3d4dcd);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    if (!bVar1) {
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) || (*(char *)*local_10 == '-')) {
        usage("average","%s: unknown argument",*local_10);
      }
      else {
        std::__cxx11::string::operator=(local_50,(char *)*local_10);
        local_10 = local_10 + 1;
      }
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    usage("average","must provide base filename.");
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    usage("average","must provide --outfile.");
  }
  pbrt::MatchingFilenames(in_stack_fffffffffffffd08);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffb08._24_8_);
  __stream = _stderr;
  this = in_stack_fffffffffffffb08._24_8_;
  if (bVar1) {
    uVar5 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s: no matching filenames!\n",uVar5);
    local_4 = 1;
    local_cc = 1;
  }
  else {
    pbrt::MaxThreadIndex();
    std::allocator<pbrt::Image>::allocator((allocator<pbrt::Image> *)0x3d4ff2);
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::vector
              (in_stack_fffffffffffffb08._40_8_,in_stack_fffffffffffffb08._32_8_,
               in_stack_fffffffffffffb08._24_8_);
    std::allocator<pbrt::Image>::~allocator((allocator<pbrt::Image> *)0x3d501e);
    local_ea[0] = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size(local_c8);
    local_120 = local_e8;
    local_118 = local_ea;
    local_128 = local_c8;
    std::function<void(long)>::function<average(int,char**)::__1,void>
              (in_stack_fffffffffffffb08._24_8_,in_stack_fffffffffffffb08._16_8_);
    pbrt::ParallelFor(in_stack_fffffffffffffb58._8_8_,in_stack_fffffffffffffb58._0_8_,
                      (function<void_(long)> *)in_stack_fffffffffffffb50);
    std::function<void_(long)>::~function((function<void_(long)> *)0x3d50b5);
    bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffb08._16_8_);
    this = in_stack_fffffffffffffb08._24_8_;
    if (bVar1) {
      local_4 = 1;
      local_cc = 1;
    }
    else {
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                (in_stack_fffffffffffffb08._8_8_);
      alloc.memoryResource._4_4_ = in_stack_fffffffffffffb94;
      alloc.memoryResource._0_4_ = in_stack_fffffffffffffb90;
      pbrt::Image::Image((Image *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                         alloc);
      local_250 = local_e8;
      local_258._M_current =
           (Image *)std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::begin
                              (in_stack_fffffffffffffb08._0_8_);
      local_260 = (Image *)std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::end
                                     (in_stack_fffffffffffffb08._0_8_);
      while (bVar1 = __gnu_cxx::operator!=
                               (in_stack_fffffffffffffb08._8_8_,in_stack_fffffffffffffb08._0_8_),
            bVar1) {
        local_268 = __gnu_cxx::
                    __normal_iterator<pbrt::Image_*,_std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>_>
                    ::operator*(&local_258);
        local_270 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_268);
        pbrt::Point2<int>::Point2
                  (in_stack_fffffffffffffb08._8_8_,in_stack_fffffffffffffb08._4_4_,
                   in_stack_fffffffffffffb08._0_4_);
        bVar1 = pbrt::Tuple2<pbrt::Point2,_int>::operator==(&local_270,&local_278);
        if (!bVar1) {
          local_280 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&local_240);
          pbrt::Point2<int>::Point2
                    (in_stack_fffffffffffffb08._8_8_,in_stack_fffffffffffffb08._4_4_,
                     in_stack_fffffffffffffb08._0_4_);
          bVar1 = pbrt::Tuple2<pbrt::Point2,_int>::operator==(&local_280,&local_288);
          if (bVar1) {
            pbrt::Image::operator=(in_stack_fffffffffffffb08._8_8_,in_stack_fffffffffffffb08._0_8_);
          }
          else {
            local_28c = 0;
            while( true ) {
              PVar6 = pbrt::Image::Resolution(&local_240);
              iStack_290 = PVar6.super_Tuple2<pbrt::Point2,_int>.y;
              if (iStack_290 <= local_28c) break;
              local_298 = 0;
              while( true ) {
                PVar6 = pbrt::Image::Resolution(&local_240);
                local_2a0 = PVar6.super_Tuple2<pbrt::Point2,_int>.x;
                if (local_2a0 <= local_298) break;
                for (local_2a4 = Repeat; iVar2 = pbrt::Image::NChannels((Image *)0x3d53c7),
                    (int)local_2a4 < iVar2; local_2a4 = local_2a4 + Black) {
                  WVar13 = (WrapMode)local_268;
                  iVar2 = (int)((ulong)local_268 >> 0x20);
                  pbrt::Point2<int>::Point2
                            (in_stack_fffffffffffffb08._8_8_,in_stack_fffffffffffffb08._4_4_,
                             in_stack_fffffffffffffb08._0_4_);
                  WVar12 = local_2a4;
                  pbrt::WrapMode2D::WrapMode2D
                            (in_stack_fffffffffffffb08._24_8_,in_stack_fffffffffffffb08._20_4_);
                  PVar6.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffba0;
                  PVar6.super_Tuple2<pbrt::Point2,_int>.x = iVar2;
                  wrapMode.wrap.values[1] = WVar13;
                  wrapMode.wrap.values[0] = WVar12;
                  FVar7 = pbrt::Image::GetChannel
                                    ((Image *)CONCAT44(in_stack_fffffffffffffb8c,
                                                       in_stack_fffffffffffffb88),PVar6,
                                     in_stack_fffffffffffffb84,wrapMode);
                  uVar3 = std::isinf((double)(ulong)(uint)FVar7);
                  in_stack_fffffffffffffb8c = CONCAT13((char)uVar3,(int3)in_stack_fffffffffffffb8c);
                  if ((uVar3 & 1) == 0) {
                    pbrt::Point2<int>::Point2
                              (in_stack_fffffffffffffb08._8_8_,in_stack_fffffffffffffb08._4_4_,
                               in_stack_fffffffffffffb08._0_4_);
                    in_stack_fffffffffffffb88 = local_2a4;
                    pbrt::Point2<int>::Point2
                              (in_stack_fffffffffffffb08._8_8_,in_stack_fffffffffffffb08._4_4_,
                               in_stack_fffffffffffffb08._0_4_);
                    in_stack_fffffffffffffb84 = local_2a4;
                    pbrt::WrapMode2D::WrapMode2D
                              (in_stack_fffffffffffffb08._24_8_,in_stack_fffffffffffffb08._20_4_);
                    p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffba0;
                    p_00.super_Tuple2<pbrt::Point2,_int>.x = iVar2;
                    wrapMode_00.wrap.values[1] = WVar13;
                    wrapMode_00.wrap.values[0] = WVar12;
                    value = pbrt::Image::GetChannel
                                      ((Image *)CONCAT44(in_stack_fffffffffffffb8c,
                                                         in_stack_fffffffffffffb88),p_00,
                                       in_stack_fffffffffffffb84,wrapMode_00);
                    p.super_Tuple2<pbrt::Point2,_int>.y = WVar12;
                    p.super_Tuple2<pbrt::Point2,_int>.x = (int)FVar7;
                    pbrt::Image::SetChannel
                              ((Image *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88
                                                ),p,in_stack_fffffffffffffb84,value);
                  }
                }
                local_298 = local_298 + 1;
              }
              local_28c = local_28c + 1;
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<pbrt::Image_*,_std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>_>::
        operator++(&local_258);
      }
      local_3d0[0].optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      local_3d0[0].set = false;
      local_3d0[0]._5_3_ = 0;
      this_00 = local_3d0;
      pstd::optional<float>::optional(this_00);
      level = (LogLevel)((ulong)this_00 >> 0x20);
      auVar8 = ZEXT1664((undefined1  [16])0x0);
      unique0x00006d80 = vmovdqu64_avx512f(auVar8);
      pstd::optional<pbrt::SquareMatrix<4>_>::optional
                ((optional<pbrt::SquareMatrix<4>_> *)(local_3d0 + 1));
      auVar9 = auVar8._24_40_;
      local_384 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
                  vmovdqu64_avx512f(auVar8);
      local_344 = 0;
      pstd::optional<pbrt::SquareMatrix<4>_>::optional
                ((optional<pbrt::SquareMatrix<4>_> *)&local_384.__align);
      auVar11 = (undefined1  [16])0x0;
      local_340 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)0x0;
      local_330 = 0;
      pstd::optional<pbrt::Bounds2<int>_>::optional
                ((optional<pbrt::Bounds2<int>_> *)&local_340.__align);
      local_324 = 0;
      local_32c = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
      pstd::optional<pbrt::Point2<int>_>::optional
                ((optional<pbrt::Point2<int>_> *)&local_32c.__align);
      pstd::optional<int>::optional((optional<int> *)&stack0xfffffffffffffce0);
      pstd::optional<float>::optional((optional<float> *)&stack0xfffffffffffffce8);
      pstd::optional<const_pbrt::RGBColorSpace_*>::optional
                ((optional<const_pbrt::RGBColorSpace_*> *)&stack0xfffffffffffffcf0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             *)0x3d5700);
      bVar1 = pbrt::Image::Write((Image *)avgImage.p8.nAlloc,(string *)avgImage.p8.ptr,
                                 (ImageMetadata *)avgImage.p8.alloc.memoryResource);
      auVar10 = auVar9._16_24_;
      if (!bVar1) {
        pbrt::LogFatal<char_const(&)[24]>
                  (level,in_stack_fffffffffffffb68,auVar11._12_4_,auVar11._0_8_,
                   (char (*) [24])in_stack_fffffffffffffb50);
      }
      pbrt::ImageMetadata::~ImageMetadata(auVar9._0_8_);
      this = auVar10._16_8_;
      local_4 = 0;
      local_cc = 1;
      pbrt::Image::~Image(auVar10._0_8_);
    }
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::~vector(this);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int average(int argc, char *argv[]) {
    std::string avgFile, filenameBase;

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("average", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "outfile", &avgFile, onError)) {
            // success
        } else if (filenameBase.empty() && argv[0][0] != '-') {
            filenameBase = *argv;
            ++argv;
        } else
            usage("average", "%s: unknown argument", *argv);
    }

    if (filenameBase.empty())
        usage("average", "must provide base filename.");
    if (avgFile.empty())
        usage("average", "must provide --outfile.");

    std::vector<std::string> filenames = MatchingFilenames(filenameBase);
    if (filenames.empty()) {
        fprintf(stderr, "%s: no matching filenames!\n", filenameBase.c_str());
        return 1;
    }

    // Compute average image
    std::vector<Image> avgImages(MaxThreadIndex());
    std::atomic<bool> failed{false};

    ParallelFor(0, filenames.size(), [&](size_t i) {
        ImageAndMetadata imRead = Image::Read(filenames[i]);
        Image &im = imRead.image;

        Image &avg = avgImages[ThreadIndex];
        if (avg.Resolution() == Point2i(0, 0))
            avg = Image(PixelFormat::Float, im.Resolution(), im.ChannelNames());
        else if (!checkImageCompatibility(filenames[i], im, filenames[0], avg)) {
            failed = true;
            return;
        }

        for (int y = 0; y < avg.Resolution().y; ++y)
            for (int x = 0; x < avg.Resolution().x; ++x)
                for (int c = 0; c < avg.NChannels(); ++c) {
                    Float v = im.GetChannel({x, y}, c) / filenames.size();
                    if (std::isnan(v))
                        LOG_FATAL("NAN Pixel at %s in %s", Point2f(x, y), filenames[i]);
                    if (std::isinf(v))
                        v = 0;
                    avg.SetChannel({x, y}, c, avg.GetChannel({x, y}, c) + v);
                }
    });

    if (failed)
        return 1;

    // Average per-thread average images
    Image avgImage;
    for (const Image &im : avgImages) {
        if (im.Resolution() == Point2i(0, 0))
            continue;
        else if (avgImage.Resolution() == Point2i(0, 0)) {
            // First valid one
            avgImage = im;
        } else {
            for (int y = 0; y < avgImage.Resolution().y; ++y)
                for (int x = 0; x < avgImage.Resolution().x; ++x)
                    for (int c = 0; c < avgImage.NChannels(); ++c) {
                        Float v = im.GetChannel({x, y}, c);
                        if (!std::isinf(v))
                            avgImage.SetChannel({x, y}, c,
                                                avgImage.GetChannel({x, y}, c) + v);
                    }
        }
    }

    CHECK(avgImage.Write(avgFile));

    return 0;
}